

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opts.h
# Opt level: O1

unique_ptr<opts::BasicOption,_std::default_delete<opts::BasicOption>_> __thiscall
opts::Option<std::__cxx11::string>
          (opts *this,string *l,
          basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *var,string *help)

{
  OptionContainer<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *this_00;
  string local_50;
  
  this_00 = (OptionContainer<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             *)operator_new(0x98);
  local_50.field_2._M_allocated_capacity._0_4_ = 0x49525453;
  local_50.field_2._M_allocated_capacity._4_2_ = 0x474e;
  local_50._M_string_length = 6;
  local_50.field_2._M_local_buf[6] = '\0';
  local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
  OptionContainer<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::OptionContainer(this_00,'\0',l,var,help,&local_50);
  *(OptionContainer<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    **)this = this_00;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p,
                    CONCAT17(local_50.field_2._M_local_buf[7],
                             CONCAT16(local_50.field_2._M_local_buf[6],
                                      CONCAT24(local_50.field_2._M_allocated_capacity._4_2_,
                                               local_50.field_2._M_allocated_capacity._0_4_))) + 1);
  }
  return (__uniq_ptr_data<opts::BasicOption,_std::default_delete<opts::BasicOption>,_true,_true>)
         (__uniq_ptr_data<opts::BasicOption,_std::default_delete<opts::BasicOption>,_true,_true>)
         this;
}

Assistant:

std::unique_ptr<BasicOption>
Option(const std::string& l, T& var, const std::string& help)               { return std::unique_ptr<BasicOption>{new OptionContainer<T>(0, l, var, help)}; }